

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O2

bool __thiscall QThreadPool::tryTake(QThreadPool *this,QRunnable *runnable)

{
  QObjectData *pQVar1;
  QObject **ppQVar2;
  long lVar3;
  QueuePage *this_00;
  bool bVar4;
  long lVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QueuePage *page;
  QueuePage *local_50;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (runnable == (QRunnable *)0x0) {
    bVar6 = false;
  }
  else {
    pQVar1 = (this->super_QObject).d_ptr.d;
    local_48._0_8_ = &pQVar1[1].children.d.size;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QBasicMutex::lock((QBasicMutex *)local_48._0_8_);
    local_48[8] = true;
    ppQVar2 = pQVar1[2].children.d.ptr;
    lVar3 = pQVar1[2].children.d.size;
    for (lVar5 = 0; bVar6 = lVar3 << 3 != lVar5, bVar6; lVar5 = lVar5 + 8) {
      this_00 = *(QueuePage **)((long)ppQVar2 + lVar5);
      local_50 = this_00;
      bVar4 = QueuePage::tryTake(this_00,runnable);
      if (bVar4) {
        if (this_00->m_lastIndex < this_00->m_firstIndex) {
          QtPrivate::sequential_erase_one<QList<QueuePage*>,QueuePage*>
                    ((QList<QueuePage_*> *)&pQVar1[2].children,&local_50);
          operator_delete(local_50,0x810);
        }
        break;
      }
    }
    QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool QThreadPool::tryTake(QRunnable *runnable)
{
    Q_D(QThreadPool);

    if (runnable == nullptr)
        return false;

    QMutexLocker locker(&d->mutex);
    for (QueuePage *page : std::as_const(d->queue)) {
        if (page->tryTake(runnable)) {
            if (page->isFinished()) {
                d->queue.removeOne(page);
                delete page;
            }
            return true;
        }
    }

    return false;
}